

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

wasm_functype_t * wasm_functype_new(wasm_valtype_vec_t *params,wasm_valtype_vec_t *results)

{
  pointer pTVar1;
  FILE *pFVar2;
  bool bVar3;
  wasm_functype_t *this;
  FuncType *pFVar4;
  pointer pTVar5;
  Type type;
  string local_50;
  
  fprintf(_stderr,"CAPI: [%s] params=%zx args=%zx\n","wasm_functype_new",params->size,results->size)
  ;
  this = (wasm_functype_t *)operator_new(0x30);
  wasm_functype_t::wasm_functype_t(this,params,results);
  fprintf(_stderr,"CAPI: [%s] ","wasm_functype_new");
  pFVar4 = wasm_externtype_t::As<wabt::interp::FuncType>((wasm_externtype_t *)this);
  fputc(0x28,_stderr);
  pTVar1 = (pFVar4->params).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar3 = true;
  for (pTVar5 = (pFVar4->params).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
                .super__Vector_impl_data._M_start; pTVar5 != pTVar1; pTVar5 = pTVar5 + 1) {
    type = *pTVar5;
    if (!bVar3) {
      fwrite(", ",2,1,_stderr);
    }
    pFVar2 = _stderr;
    wabt::Type::GetName_abi_cxx11_(&local_50,&type);
    fputs(local_50._M_dataplus._M_p,pFVar2);
    std::__cxx11::string::_M_dispose();
    bVar3 = false;
  }
  fwrite(") -> (",6,1,_stderr);
  pTVar1 = (pFVar4->results).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar3 = true;
  for (pTVar5 = (pFVar4->results).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                _M_impl.super__Vector_impl_data._M_start; pTVar5 != pTVar1; pTVar5 = pTVar5 + 1) {
    type = *pTVar5;
    if (!bVar3) {
      fwrite(", ",2,1,_stderr);
    }
    pFVar2 = _stderr;
    wabt::Type::GetName_abi_cxx11_(&local_50,&type);
    fputs(local_50._M_dataplus._M_p,pFVar2);
    std::__cxx11::string::_M_dispose();
    bVar3 = false;
  }
  fwrite(")\n",2,1,_stderr);
  return this;
}

Assistant:

own wasm_functype_t* wasm_functype_new(own wasm_valtype_vec_t* params,
                                       own wasm_valtype_vec_t* results) {
  TRACE("params=%" PRIzx " args=%" PRIzx, params->size, results->size);
  auto* res = new wasm_functype_t{params, results};
  TRACE_NO_NL("");
  print_sig(*res->As<FuncType>());
  return res;
}